

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O1

void __thiscall CVmObjBigNum::wp8(CVmObjBigNum *this,char *buf,int *ov)

{
  byte bVar1;
  byte bVar2;
  int carry;
  size_t i;
  long lVar3;
  
  wp8abs(this,buf,ov);
  if (((this->super_CVmObject).ext_[4] & 1U) != 0) {
    *ov = 1;
    bVar2 = 1;
    lVar3 = 0;
    do {
      bVar1 = buf[lVar3];
      buf[lVar3] = ~bVar1 + bVar2;
      bVar2 = bVar2 & (byte)(~bVar1 + bVar2) == '\0';
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
  }
  return;
}

Assistant:

void CVmObjBigNum::wp8(char *buf, int &ov) const
{
    /* generate the absolute value */
    wp8abs(buf, ov);

    /* 
     *   if the value is negative, we can't represent it as unsigned; take
     *   the two's complement in case they want the truncated version of the
     *   value, and set the overflow flag 
     */
    if (get_neg(ext_))
    {
        ov = TRUE;
        twos_complement_p8((unsigned char *)buf);
    }
}